

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecmult_multi(secp256k1_scratch *scratch,secp256k1_ecmult_multi_func ecmult_multi)

{
  size_t sVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  secp256k1_scalar *psVar10;
  long lVar11;
  secp256k1_gej *r_00;
  secp256k1_ge *psVar12;
  ulong uVar13;
  secp256k1_gej *psVar14;
  secp256k1_gej *psVar15;
  secp256k1_strauss_point_state *psVar16;
  secp256k1_strauss_point_state *psVar17;
  secp256k1_ge *psVar18;
  uint64_t *puVar19;
  code *cb;
  secp256k1_scalar **cbdata;
  secp256k1_scalar **ppsVar20;
  long lVar21;
  byte bVar22;
  ecmult_multi_data data;
  secp256k1_scalar t1;
  secp256k1_scalar t0;
  secp256k1_gej t1p;
  secp256k1_gej r;
  secp256k1_gej ptgj;
  secp256k1_gej expected;
  secp256k1_scalar tmp2;
  secp256k1_scalar tmp1;
  secp256k1_ge ptg;
  secp256k1_gej r2;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_ge ptg_4;
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pt [32];
  size_t sStack_1f00;
  secp256k1_scalar *local_1ee8;
  secp256k1_ge *local_1ee0;
  ulong local_1ed8;
  ulong local_1ed0;
  ulong local_1ec8;
  ulong local_1ec0;
  ulong local_1eb8;
  ulong local_1eb0;
  ulong local_1ea8;
  secp256k1_scalar local_1ea0;
  secp256k1_scalar local_1e80;
  secp256k1_strauss_state local_1e60;
  secp256k1_gej local_1e48;
  undefined1 local_1db0 [152];
  secp256k1_gej local_1d18;
  secp256k1_gej local_1c80;
  secp256k1_scalar local_1be8;
  secp256k1_scalar local_1bc8;
  secp256k1_scalar local_1ba8;
  secp256k1_scalar local_1b88;
  secp256k1_scalar local_1b68 [28];
  secp256k1_scalar local_17e8;
  secp256k1_scalar local_17c8;
  secp256k1_gej local_17a8;
  secp256k1_gej local_1710;
  secp256k1_fe local_1678 [8];
  secp256k1_ge local_14f8 [8];
  secp256k1_ge local_11b0;
  secp256k1_strauss_point_state local_1148;
  secp256k1_ge local_d38;
  secp256k1_ge local_cd0 [31];
  
  bVar22 = 0;
  local_1ee8 = &local_1be8;
  cbdata = &local_1ee8;
  local_1ee0 = &local_d38;
  psVar16 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = ecmult_multi_callback;
  psVar10 = (secp256k1_scalar *)0x0;
  psVar14 = (secp256k1_gej *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar16,scratch,(secp256k1_gej *)local_1db0,
                          (secp256k1_scalar *)0x0,ecmult_multi_callback,cbdata,0);
  if (iVar5 == 0) goto LAB_00159301;
  if (0 < COUNT) {
    iVar5 = 0;
    do {
      local_1ed8 = CONCAT44(local_1ed8._4_4_,iVar5);
      testutil_random_scalar_order(&local_1be8);
      testutil_random_scalar_order(&local_1bc8);
      testutil_random_ge_test((secp256k1_ge *)&local_17a8);
      secp256k1_gej_set_ge(&local_1d18,(secp256k1_ge *)&local_17a8);
      local_1e48.x.n[1] = (uint64_t)local_14f8;
      psVar14 = &local_17a8;
      psVar12 = &local_d38;
      for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
        (psVar12->x).n[0] = (psVar14->x).n[0];
        psVar14 = (secp256k1_gej *)((long)psVar14 + (ulong)bVar22 * -0x10 + 8);
        psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar22 * -2 + 1) * 8);
      }
      psVar12 = &secp256k1_ge_const_g;
      psVar18 = local_cd0;
      for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
        (psVar18->x).n[0] = (psVar12->x).n[0];
        psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar22 * -2 + 1) * 8);
        psVar18 = (secp256k1_ge *)((long)psVar18 + ((ulong)bVar22 * -2 + 1) * 8);
      }
      psVar15 = &local_1710;
      psVar10 = &local_1be8;
      local_1e48.x.n[0] = (uint64_t)local_1678;
      local_1e48.x.n[2] = (uint64_t)&local_1148;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1e48,psVar15,1,&local_1d18,&secp256k1_scalar_zero
                 ,psVar10);
      psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      ppsVar20 = &local_1ee8;
      psVar14 = (secp256k1_gej *)scratch;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                              psVar10,ecmult_multi_callback,ppsVar20,0);
      if (iVar5 == 0) goto LAB_001592b6;
      psVar14 = psVar15;
      psVar17 = (secp256k1_strauss_point_state *)local_1db0;
      iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,psVar15);
      if (iVar5 == 0) goto LAB_001592bb;
      local_1e48.x.n[1] = (uint64_t)local_14f8;
      local_1e48.x.n[0] = (uint64_t)local_1678;
      local_1e48.x.n[2] = (uint64_t)&local_1148;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1e48,psVar15,1,&local_1d18,&local_1be8,
                 &secp256k1_scalar_zero);
      psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar10 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      cbdata = &local_1ee8;
      psVar14 = (secp256k1_gej *)scratch;
      ppsVar20 = cbdata;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                              &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,1);
      if (iVar5 == 0) goto LAB_001592c0;
      psVar17 = (secp256k1_strauss_point_state *)local_1db0;
      iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,psVar15);
      if (iVar5 == 0) goto LAB_001592c5;
      psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar10 = &secp256k1_scalar_zero;
      cb = ecmult_multi_false_callback;
      psVar15 = (secp256k1_gej *)scratch;
      ppsVar20 = cbdata;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                              &secp256k1_scalar_zero,ecmult_multi_false_callback,cbdata,1);
      if (iVar5 != 0) goto LAB_001592ca;
      local_1e48.x.n[0] = (uint64_t)local_1678;
      local_1e48.x.n[1] = (uint64_t)local_14f8;
      local_1e48.x.n[2] = (uint64_t)&local_1148;
      psVar14 = &local_1710;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1e48,psVar14,1,&local_1d18,&local_1be8,
                 &local_1bc8);
      psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar10 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      psVar15 = (secp256k1_gej *)scratch;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                              &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,2);
      if (iVar5 == 0) goto LAB_001592cf;
      psVar15 = psVar14;
      psVar17 = (secp256k1_strauss_point_state *)local_1db0;
      iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,psVar14);
      if (iVar5 == 0) goto LAB_001592d4;
      local_1e48.x.n[0] = (uint64_t)local_1678;
      local_1e48.x.n[1] = (uint64_t)local_14f8;
      local_1e48.x.n[2] = (uint64_t)&local_1148;
      psVar10 = &local_1bc8;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1e48,psVar14,1,&local_1d18,&local_1be8,psVar10);
      psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cbdata = &local_1ee8;
      cb = ecmult_multi_callback;
      psVar15 = (secp256k1_gej *)scratch;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                              psVar10,ecmult_multi_callback,cbdata,1);
      if (iVar5 == 0) goto LAB_001592d9;
      psVar17 = (secp256k1_strauss_point_state *)local_1db0;
      iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,psVar14);
      if (iVar5 == 0) goto LAB_001592de;
      iVar5 = (int)local_1ed8 + 1;
    } while (iVar5 < COUNT);
  }
  if (0 < COUNT) {
    uVar8 = 0;
    do {
      lVar9 = 0;
      local_1ed8 = uVar8;
      do {
        psVar12 = &local_d38;
        lVar21 = 0;
        do {
          testutil_random_scalar_order((secp256k1_scalar *)((long)local_1be8.d + lVar21));
          secp256k1_ge_set_infinity(psVar12);
          lVar21 = lVar21 + 0x20;
          psVar12 = psVar12 + 1;
        } while (lVar21 != 0x400);
        psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar10 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        ppsVar20 = &local_1ee8;
        psVar14 = (secp256k1_gej *)scratch;
        iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                                &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar20,
                                (&DAT_001891e0)[lVar9]);
        if (iVar5 == 0) goto LAB_0015928e;
        psVar17 = (secp256k1_strauss_point_state *)local_1db0;
        secp256k1_gej_verify((secp256k1_gej *)local_1db0);
        if (local_1db0._144_4_ == 0) goto LAB_00159293;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar9 = 0;
      do {
        psVar10 = &local_1be8;
        lVar21 = 0;
        do {
          testutil_random_ge_test((secp256k1_ge *)&local_1148);
          psVar16 = &local_1148;
          puVar19 = (uint64_t *)((long)local_d38.x.n + lVar21);
          for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar19 = ((secp256k1_fe *)psVar16->wnaf_na_1)->n[0];
            psVar16 = (secp256k1_strauss_point_state *)((long)psVar16 + (ulong)bVar22 * -0x10 + 8);
            puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
          }
          psVar10->d[2] = 0;
          psVar10->d[3] = 0;
          psVar10->d[0] = 0;
          psVar10->d[1] = 0;
          secp256k1_scalar_verify(psVar10);
          lVar21 = lVar21 + 0x68;
          psVar10 = psVar10 + 1;
        } while (lVar21 != 0xd00);
        psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar10 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        ppsVar20 = &local_1ee8;
        psVar14 = (secp256k1_gej *)scratch;
        iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                                &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar20,
                                (&DAT_001891e0)[lVar9]);
        if (iVar5 == 0) goto LAB_00159298;
        psVar17 = (secp256k1_strauss_point_state *)local_1db0;
        secp256k1_gej_verify((secp256k1_gej *)local_1db0);
        if (local_1db0._144_4_ == 0) goto LAB_0015929d;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar9 = 0;
      do {
        testutil_random_ge_test((secp256k1_ge *)&local_1148);
        lVar21 = 0x68;
        psVar10 = &local_1be8;
        do {
          testutil_random_scalar_order(psVar10);
          secp256k1_scalar_negate(psVar10 + 1,psVar10);
          psVar16 = &local_1148;
          puVar19 = (uint64_t *)((long)(&local_d38)[-1].x.n + lVar21);
          for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar19 = ((secp256k1_fe *)psVar16->wnaf_na_1)->n[0];
            psVar16 = (secp256k1_strauss_point_state *)((long)psVar16 + (ulong)bVar22 * -0x10 + 8);
            puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
          }
          psVar16 = &local_1148;
          puVar19 = (uint64_t *)((long)local_d38.x.n + lVar21);
          for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar19 = ((secp256k1_fe *)psVar16->wnaf_na_1)->n[0];
            psVar16 = (secp256k1_strauss_point_state *)((long)psVar16 + (ulong)bVar22 * -0x10 + 8);
            puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
          }
          lVar21 = lVar21 + 0xd0;
          psVar10 = psVar10 + 2;
        } while (lVar21 != 0xd68);
        psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
        sVar1 = (&DAT_001891e0)[lVar9];
        psVar10 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        ppsVar20 = &local_1ee8;
        psVar14 = (secp256k1_gej *)scratch;
        iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                                &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar20,sVar1);
        if (iVar5 == 0) goto LAB_001592a2;
        psVar17 = (secp256k1_strauss_point_state *)local_1db0;
        secp256k1_gej_verify((secp256k1_gej *)local_1db0);
        if (local_1db0._144_4_ == 0) goto LAB_001592a7;
        testutil_random_scalar_order(&local_1be8);
        lVar21 = 0x20;
        psVar12 = &local_d38;
        do {
          testutil_random_ge_test((secp256k1_ge *)&local_1148);
          uVar3 = local_1be8.d[3];
          uVar2 = local_1be8.d[1];
          *(uint64_t *)((long)local_1c80.z.n + lVar21 + 0x28) = local_1be8.d[2];
          *(uint64_t *)((long)(&local_1c80.z + 1) + lVar21) = uVar3;
          *(uint64_t *)((long)local_1c80.z.n + lVar21 + 0x18) = local_1be8.d[0];
          *(uint64_t *)((long)local_1c80.z.n + lVar21 + 0x20) = uVar2;
          *(uint64_t *)((long)local_1be8.d + lVar21) = local_1be8.d[0];
          *(uint64_t *)((long)local_1be8.d + lVar21 + 8) = local_1be8.d[1];
          *(uint64_t *)((long)local_1be8.d + lVar21 + 0x10) = local_1be8.d[2];
          *(uint64_t *)((long)local_1be8.d + lVar21 + 0x18) = local_1be8.d[3];
          psVar16 = &local_1148;
          psVar18 = psVar12;
          for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
            (psVar18->x).n[0] = ((secp256k1_fe *)psVar16->wnaf_na_1)->n[0];
            psVar16 = (secp256k1_strauss_point_state *)((long)psVar16 + (ulong)bVar22 * -0x10 + 8);
            psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar22 * -0x10 + 8);
          }
          secp256k1_ge_neg(psVar12 + 1,psVar12);
          lVar21 = lVar21 + 0x40;
          psVar12 = psVar12 + 2;
        } while (lVar21 != 0x420);
        psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar10 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        ppsVar20 = &local_1ee8;
        psVar14 = (secp256k1_gej *)scratch;
        iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                                &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar20,sVar1);
        if (iVar5 == 0) goto LAB_001592ac;
        psVar17 = (secp256k1_strauss_point_state *)local_1db0;
        secp256k1_gej_verify((secp256k1_gej *)local_1db0);
        if (local_1db0._144_4_ == 0) goto LAB_001592b1;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      testutil_random_ge_test((secp256k1_ge *)&local_1148);
      local_1be8.d[2] = 0;
      local_1be8.d[3] = 0;
      local_1be8.d[0] = 0;
      local_1be8.d[1] = 0;
      secp256k1_scalar_verify(&local_1be8);
      psVar16 = &local_1148;
      psVar12 = &local_d38;
      for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
        (psVar12->x).n[0] = ((secp256k1_fe *)psVar16->wnaf_na_1)->n[0];
        psVar16 = (secp256k1_strauss_point_state *)((long)psVar16 + (ulong)bVar22 * -0x10 + 8);
        psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar22 * -2 + 1) * 8);
      }
      lVar9 = 0x68;
      psVar10 = &local_1bc8;
      do {
        psVar16 = &local_1148;
        puVar19 = (uint64_t *)((long)local_d38.x.n + lVar9);
        for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
          *puVar19 = ((secp256k1_fe *)psVar16->wnaf_na_1)->n[0];
          psVar16 = (secp256k1_strauss_point_state *)((long)psVar16 + (ulong)bVar22 * -0x10 + 8);
          puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
        }
        testutil_random_scalar_order(psVar10);
        secp256k1_scalar_add(&local_1be8,&local_1be8,psVar10);
        secp256k1_scalar_negate(psVar10,psVar10);
        lVar9 = lVar9 + 0x68;
        psVar10 = psVar10 + 1;
      } while (lVar9 != 0xd00);
      psVar16 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar10 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      cbdata = &local_1ee8;
      psVar14 = (secp256k1_gej *)scratch;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar16,scratch,(secp256k1_gej *)local_1db0,
                              &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x20);
      if (iVar5 == 0) goto LAB_001592f7;
      psVar16 = (secp256k1_strauss_point_state *)local_1db0;
      secp256k1_gej_verify((secp256k1_gej *)local_1db0);
      if (local_1db0._144_4_ == 0) goto LAB_001592fc;
      uVar6 = (int)local_1ed8 + 1;
      uVar8 = (ulong)uVar6;
    } while ((int)uVar6 < COUNT);
  }
  if (0 < COUNT) {
    iVar5 = 0;
    do {
      secp256k1_gej_set_infinity((secp256k1_gej *)local_1db0);
      testutil_random_scalar_order(&local_1be8);
      psVar12 = &local_d38;
      lVar9 = 0;
      do {
        uVar4 = local_1be8.d[3];
        uVar3 = local_1be8.d[2];
        uVar2 = local_1be8.d[1];
        *(uint64_t *)((long)local_1be8.d + lVar9) = local_1be8.d[0];
        *(uint64_t *)((long)local_1be8.d + lVar9 + 8) = uVar2;
        *(uint64_t *)((long)local_1be8.d + lVar9 + 0x10) = uVar3;
        *(uint64_t *)((long)local_1be8.d + lVar9 + 0x18) = uVar4;
        testutil_random_ge_test((secp256k1_ge *)&local_1148);
        psVar16 = &local_1148;
        psVar18 = psVar12;
        for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
          (psVar18->x).n[0] = ((secp256k1_fe *)psVar16->wnaf_na_1)->n[0];
          psVar16 = (secp256k1_strauss_point_state *)((long)psVar16 + (ulong)bVar22 * -0x10 + 8);
          psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar22 * -0x10 + 8);
        }
        secp256k1_gej_add_ge_var
                  ((secp256k1_gej *)local_1db0,(secp256k1_gej *)local_1db0,psVar12,
                   (secp256k1_fe *)0x0);
        lVar9 = lVar9 + 0x20;
        psVar12 = psVar12 + 1;
      } while (lVar9 != 0x280);
      local_1d18.x.n[0] = (uint64_t)local_1678;
      local_1d18.x.n[1] = (uint64_t)local_14f8;
      local_1d18.x.n[2] = (uint64_t)&local_1148;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1d18,&local_1710,1,(secp256k1_gej *)local_1db0,
                 &local_1be8,&secp256k1_scalar_zero);
      psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar10 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      cbdata = &local_1ee8;
      psVar14 = (secp256k1_gej *)scratch;
      iVar7 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                              &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
      if (iVar7 == 0) goto LAB_001592e3;
      psVar14 = &local_1710;
      psVar17 = (secp256k1_strauss_point_state *)local_1db0;
      iVar7 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,&local_1710);
      if (iVar7 == 0) goto LAB_001592e8;
      iVar5 = iVar5 + 1;
    } while (iVar5 < COUNT);
  }
  if (0 < COUNT) {
    iVar5 = 0;
    do {
      local_1e48.x.n[2] = 0;
      local_1e48.x.n[3] = 0;
      local_1e48.x.n[0] = 0;
      local_1e48.x.n[1] = 0;
      secp256k1_scalar_verify((secp256k1_scalar *)&local_1e48);
      testutil_random_ge_test((secp256k1_ge *)&local_17a8);
      psVar10 = &local_1be8;
      lVar9 = 0;
      do {
        testutil_random_scalar_order(psVar10);
        psVar14 = &local_17a8;
        puVar19 = (uint64_t *)((long)local_d38.x.n + lVar9);
        for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
          *puVar19 = (psVar14->x).n[0];
          psVar14 = (secp256k1_gej *)((long)psVar14 + (ulong)bVar22 * -0x10 + 8);
          puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
        }
        secp256k1_scalar_add
                  ((secp256k1_scalar *)&local_1e48,(secp256k1_scalar *)&local_1e48,psVar10);
        lVar9 = lVar9 + 0x68;
        psVar10 = psVar10 + 1;
      } while (lVar9 != 0x820);
      secp256k1_gej_set_ge(&local_1d18,&local_d38);
      local_1c80.x.n[0] = (uint64_t)local_1678;
      local_1c80.x.n[1] = (uint64_t)local_14f8;
      local_1c80.x.n[2] = (uint64_t)&local_1148;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1c80,&local_1710,1,&local_1d18,
                 (secp256k1_scalar *)&local_1e48,&secp256k1_scalar_zero);
      psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar16 = (secp256k1_strauss_point_state *)local_1db0;
      psVar10 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      cbdata = &local_1ee8;
      psVar14 = (secp256k1_gej *)scratch;
      iVar7 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)psVar16,
                              &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
      if (iVar7 == 0) goto LAB_001592ed;
      psVar14 = &local_1710;
      iVar7 = secp256k1_gej_eq_var((secp256k1_gej *)psVar16,&local_1710);
      if (iVar7 == 0) goto LAB_001592f2;
      iVar5 = iVar5 + 1;
    } while (iVar5 < COUNT);
  }
  lVar9 = 0;
  psVar12 = &local_d38;
  do {
    testutil_random_scalar_order((secp256k1_scalar *)((long)local_1be8.d + lVar9));
    testutil_random_ge_test(psVar12);
    psVar12 = psVar12 + 1;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x280);
  local_1be8.d[2] = 0;
  local_1be8.d[3] = 0;
  local_1be8.d[0] = 0;
  local_1be8.d[1] = 0;
  secp256k1_scalar_verify(&local_1be8);
  psVar16 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar10 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1ee8;
  psVar14 = (secp256k1_gej *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar16,scratch,(secp256k1_gej *)local_1db0,
                          &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
  if (iVar5 == 0) goto LAB_00159306;
  local_1bc8.d[2] = 0;
  local_1bc8.d[3] = 0;
  local_1bc8.d[0] = 0;
  local_1bc8.d[1] = 0;
  secp256k1_scalar_verify(&local_1bc8);
  local_1ba8.d[2] = 0;
  local_1ba8.d[3] = 0;
  local_1ba8.d[0] = 0;
  local_1ba8.d[1] = 0;
  secp256k1_scalar_verify(&local_1ba8);
  local_1b88.d[2] = 0;
  local_1b88.d[3] = 0;
  local_1b88.d[0] = 0;
  local_1b88.d[1] = 0;
  secp256k1_scalar_verify(&local_1b88);
  local_1b68[0].d[2] = 0;
  local_1b68[0].d[3] = 0;
  local_1b68[0].d[0] = 0;
  local_1b68[0].d[1] = 0;
  secp256k1_scalar_verify(local_1b68);
  psVar16 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar10 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1ee8;
  psVar14 = (secp256k1_gej *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar16,scratch,(secp256k1_gej *)local_1db0,
                          &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,6);
  if (iVar5 == 0) goto LAB_0015930b;
  psVar16 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar10 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1ee8;
  psVar14 = (secp256k1_gej *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar16,scratch,(secp256k1_gej *)local_1db0,
                          &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,5);
  if (iVar5 != 0) {
    psVar16 = (secp256k1_strauss_point_state *)local_1db0;
    secp256k1_gej_verify((secp256k1_gej *)psVar16);
    if (local_1db0._144_4_ != 0) {
      testutil_random_ge_test(&local_11b0);
      secp256k1_gej_set_ge(&local_1d18,&local_11b0);
      local_1ed0 = 0;
      do {
        local_1ec8 = local_1ed0 + 1 >> 1;
        local_1ec0 = (ulong)((uint)local_1ed0 & 1);
        uVar8 = 0;
        local_1ed0 = local_1ed0 + 1;
        do {
          uVar13 = local_1ec0;
          local_1e80.d[3] = 0;
          local_1e80.d[1] = 0;
          local_1e80.d[2] = 0;
          local_1e80.d[0] = local_1ec8;
          secp256k1_scalar_verify(&local_1e80);
          secp256k1_scalar_cond_negate(&local_1e80,(int)uVar13);
          local_1eb8 = uVar8 + 1;
          local_1ea0.d[0] = local_1eb8 >> 1;
          local_1ea0.d[1] = 0;
          local_1ea0.d[2] = 0;
          local_1ea0.d[3] = 0;
          secp256k1_scalar_verify(&local_1ea0);
          secp256k1_scalar_cond_negate(&local_1ea0,(uint)uVar8 & 1);
          local_1e48.x.n[0] = (uint64_t)local_1678;
          local_1e48.x.n[1] = (uint64_t)local_14f8;
          local_1e48.x.n[2] = (uint64_t)&local_1148;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_1e48,&local_17a8,1,&local_1d18,&local_1e80,
                     &secp256k1_scalar_zero);
          local_1c80.x.n[0] = (uint64_t)local_1678;
          local_1c80.x.n[1] = (uint64_t)local_14f8;
          local_1c80.x.n[2] = (uint64_t)&local_1148;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_1c80,&local_1e48,1,&local_1d18,&local_1ea0,
                     &secp256k1_scalar_zero);
          local_1eb0 = 0;
          do {
            local_1ea8 = local_1eb0 + 1 >> 1;
            local_1ed8 = (ulong)((uint)local_1eb0 & 1);
            uVar8 = 0;
            local_1eb0 = local_1eb0 + 1;
            do {
              secp256k1_ge_set_gej(&local_d38,&local_17a8);
              secp256k1_ge_set_gej(local_cd0,&local_1e48);
              local_1be8.d[0] = local_1ea8;
              local_1be8.d[3] = 0;
              local_1be8.d[1] = 0;
              local_1be8.d[2] = 0;
              secp256k1_scalar_verify(&local_1be8);
              secp256k1_scalar_cond_negate(&local_1be8,(int)local_1ed8);
              uVar13 = uVar8 + 1;
              local_1bc8.d[0] = uVar13 >> 1;
              local_1bc8.d[1] = 0;
              local_1bc8.d[2] = 0;
              local_1bc8.d[3] = 0;
              secp256k1_scalar_verify(&local_1bc8);
              psVar15 = &local_1c80;
              secp256k1_scalar_cond_negate(&local_1bc8,(uint)uVar8 & 1);
              secp256k1_scalar_mul(&local_17c8,&local_1e80,&local_1be8);
              secp256k1_scalar_mul(&local_17e8,&local_1ea0,&local_1bc8);
              secp256k1_scalar_add(&local_17c8,&local_17c8,&local_17e8);
              local_1e60.aux = local_1678;
              local_1e60.pre_a = local_14f8;
              psVar16 = &local_1148;
              local_1e60.ps = psVar16;
              secp256k1_ecmult_strauss_wnaf
                        (&local_1e60,psVar15,1,&local_1d18,&local_17c8,&secp256k1_scalar_zero);
              psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
              psVar10 = &secp256k1_scalar_zero;
              cb = ecmult_multi_callback;
              ppsVar20 = &local_1ee8;
              psVar14 = (secp256k1_gej *)scratch;
              iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)psVar16
                                      ,&secp256k1_scalar_zero,ecmult_multi_callback,ppsVar20,2);
              if (iVar5 == 0) {
                test_ecmult_multi_cold_3();
LAB_00159289:
                test_ecmult_multi_cold_2();
                goto LAB_0015928e;
              }
              iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)psVar16,psVar15);
              psVar14 = psVar15;
              psVar17 = psVar16;
              if (iVar5 == 0) goto LAB_00159289;
              uVar8 = uVar13;
            } while (uVar13 != 8);
          } while (local_1eb0 != 8);
          uVar8 = local_1eb8;
        } while (local_1eb8 != 8);
        if (local_1ed0 == 8) {
          return;
        }
      } while( true );
    }
    goto LAB_00159315;
  }
  goto LAB_00159310;
LAB_0015928e:
  test_ecmult_multi_cold_21();
LAB_00159293:
  test_ecmult_multi_cold_20();
LAB_00159298:
  test_ecmult_multi_cold_19();
LAB_0015929d:
  test_ecmult_multi_cold_18();
LAB_001592a2:
  test_ecmult_multi_cold_17();
LAB_001592a7:
  test_ecmult_multi_cold_16();
LAB_001592ac:
  test_ecmult_multi_cold_15();
LAB_001592b1:
  test_ecmult_multi_cold_14();
LAB_001592b6:
  test_ecmult_multi_cold_29();
LAB_001592bb:
  test_ecmult_multi_cold_28();
LAB_001592c0:
  psVar15 = psVar14;
  test_ecmult_multi_cold_27();
LAB_001592c5:
  test_ecmult_multi_cold_26();
LAB_001592ca:
  cbdata = ppsVar20;
  test_ecmult_multi_cold_1();
LAB_001592cf:
  test_ecmult_multi_cold_25();
LAB_001592d4:
  test_ecmult_multi_cold_24();
LAB_001592d9:
  psVar14 = psVar15;
  test_ecmult_multi_cold_23();
LAB_001592de:
  test_ecmult_multi_cold_22();
LAB_001592e3:
  test_ecmult_multi_cold_11();
LAB_001592e8:
  test_ecmult_multi_cold_10();
LAB_001592ed:
  psVar16 = psVar17;
  test_ecmult_multi_cold_9();
LAB_001592f2:
  test_ecmult_multi_cold_8();
LAB_001592f7:
  test_ecmult_multi_cold_13();
LAB_001592fc:
  test_ecmult_multi_cold_12();
LAB_00159301:
  test_ecmult_multi_cold_30();
LAB_00159306:
  test_ecmult_multi_cold_7();
LAB_0015930b:
  test_ecmult_multi_cold_6();
LAB_00159310:
  test_ecmult_multi_cold_5();
LAB_00159315:
  test_ecmult_multi_cold_4();
  secp256k1_ecmult_pippenger_batch
            ((secp256k1_callback *)psVar16,(secp256k1_scratch *)psVar14,r_00,psVar10,cb,cbdata,
             sStack_1f00,0);
  return;
}

Assistant:

static void test_ecmult_multi(secp256k1_scratch *scratch, secp256k1_ecmult_multi_func ecmult_multi) {
    int ncount;
    secp256k1_scalar sc[32];
    secp256k1_ge pt[32];
    secp256k1_gej r;
    secp256k1_gej r2;
    ecmult_multi_data data;

    data.sc = sc;
    data.pt = pt;

    /* No points to multiply */
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, NULL, ecmult_multi_callback, &data, 0));

    /* Check 1- and 2-point multiplies against ecmult */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        secp256k1_gej ptgj;
        testutil_random_scalar_order(&sc[0]);
        testutil_random_scalar_order(&sc[1]);

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);
        pt[0] = ptg;
        pt[1] = secp256k1_ge_const_g;

        /* only G scalar */
        secp256k1_ecmult(&r2, &ptgj, &secp256k1_scalar_zero, &sc[0]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[0], ecmult_multi_callback, &data, 0));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 1-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* Try to multiply 1 point, but callback returns false */
        CHECK(!ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_false_callback, &data, 1));

        /* 2-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 2-point with G scalar */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[1], ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check infinite outputs of various forms */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        size_t i, j;
        size_t sizes[] = { 2, 10, 32 };

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_scalar_order(&sc[i]);
                secp256k1_ge_set_infinity(&pt[i]);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_ge_test(&ptg);
                pt[i] = ptg;
                secp256k1_scalar_set_int(&sc[i], 0);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            testutil_random_ge_test(&ptg);
            for (i = 0; i < 16; i++) {
                testutil_random_scalar_order(&sc[2*i]);
                secp256k1_scalar_negate(&sc[2*i + 1], &sc[2*i]);
                pt[2 * i] = ptg;
                pt[2 * i + 1] = ptg;
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));

            testutil_random_scalar_order(&sc[0]);
            for (i = 0; i < 16; i++) {
                testutil_random_ge_test(&ptg);

                sc[2*i] = sc[0];
                sc[2*i+1] = sc[0];
                pt[2 * i] = ptg;
                secp256k1_ge_neg(&pt[2*i+1], &pt[2*i]);
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        testutil_random_ge_test(&ptg);
        secp256k1_scalar_set_int(&sc[0], 0);
        pt[0] = ptg;
        for (i = 1; i < 32; i++) {
            pt[i] = ptg;

            testutil_random_scalar_order(&sc[i]);
            secp256k1_scalar_add(&sc[0], &sc[0], &sc[i]);
            secp256k1_scalar_negate(&sc[i], &sc[i]);
        }

        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 32));
        CHECK(secp256k1_gej_is_infinity(&r));
    }

    /* Check random points, constant scalar */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_gej_set_infinity(&r);

        testutil_random_scalar_order(&sc[0]);
        for (i = 0; i < 20; i++) {
            secp256k1_ge ptg;
            sc[i] = sc[0];
            testutil_random_ge_test(&ptg);
            pt[i] = ptg;
            secp256k1_gej_add_ge_var(&r, &r, &pt[i], NULL);
        }

        secp256k1_ecmult(&r2, &r, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check random scalars, constant point */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_ge ptg;
        secp256k1_gej p0j;
        secp256k1_scalar rs;
        secp256k1_scalar_set_int(&rs, 0);

        testutil_random_ge_test(&ptg);
        for (i = 0; i < 20; i++) {
            testutil_random_scalar_order(&sc[i]);
            pt[i] = ptg;
            secp256k1_scalar_add(&rs, &rs, &sc[i]);
        }

        secp256k1_gej_set_ge(&p0j, &pt[0]);
        secp256k1_ecmult(&r2, &p0j, &rs, &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Sanity check that zero scalars don't cause problems */
    for (ncount = 0; ncount < 20; ncount++) {
        testutil_random_scalar_order(&sc[ncount]);
        testutil_random_ge_test(&pt[ncount]);
    }

    secp256k1_scalar_set_int(&sc[0], 0);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
    secp256k1_scalar_set_int(&sc[1], 0);
    secp256k1_scalar_set_int(&sc[2], 0);
    secp256k1_scalar_set_int(&sc[3], 0);
    secp256k1_scalar_set_int(&sc[4], 0);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 6));
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 5));
    CHECK(secp256k1_gej_is_infinity(&r));

    /* Run through s0*(t0*P) + s1*(t1*P) exhaustively for many small values of s0, s1, t0, t1 */
    {
        const size_t TOP = 8;
        size_t s0i, s1i;
        size_t t0i, t1i;
        secp256k1_ge ptg;
        secp256k1_gej ptgj;

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);

        for(t0i = 0; t0i < TOP; t0i++) {
            for(t1i = 0; t1i < TOP; t1i++) {
                secp256k1_gej t0p, t1p;
                secp256k1_scalar t0, t1;

                secp256k1_scalar_set_int(&t0, (t0i + 1) / 2);
                secp256k1_scalar_cond_negate(&t0, t0i & 1);
                secp256k1_scalar_set_int(&t1, (t1i + 1) / 2);
                secp256k1_scalar_cond_negate(&t1, t1i & 1);

                secp256k1_ecmult(&t0p, &ptgj, &t0, &secp256k1_scalar_zero);
                secp256k1_ecmult(&t1p, &ptgj, &t1, &secp256k1_scalar_zero);

                for(s0i = 0; s0i < TOP; s0i++) {
                    for(s1i = 0; s1i < TOP; s1i++) {
                        secp256k1_scalar tmp1, tmp2;
                        secp256k1_gej expected, actual;

                        secp256k1_ge_set_gej(&pt[0], &t0p);
                        secp256k1_ge_set_gej(&pt[1], &t1p);

                        secp256k1_scalar_set_int(&sc[0], (s0i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[0], s0i & 1);
                        secp256k1_scalar_set_int(&sc[1], (s1i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[1], s1i & 1);

                        secp256k1_scalar_mul(&tmp1, &t0, &sc[0]);
                        secp256k1_scalar_mul(&tmp2, &t1, &sc[1]);
                        secp256k1_scalar_add(&tmp1, &tmp1, &tmp2);

                        secp256k1_ecmult(&expected, &ptgj, &tmp1, &secp256k1_scalar_zero);
                        CHECK(ecmult_multi(&CTX->error_callback, scratch, &actual, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
                        CHECK(secp256k1_gej_eq_var(&actual, &expected));
                    }
                }
            }
        }
    }
}